

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int * i4vec_uniform_ab_new(int n,int a,int b,int *seed)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  double dVar4;
  int *x;
  int value;
  float r;
  int k;
  int i4_huge;
  int i;
  int c;
  int *seed_local;
  int local_10;
  int b_local;
  int a_local;
  int n_local;
  
  if (*seed == 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"I4VEC_UNIFORM_AB_NEW - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input value of SEED = 0.\n");
    exit(1);
  }
  seed_local._4_4_ = b;
  local_10 = a;
  if (b < a) {
    seed_local._4_4_ = a;
    local_10 = b;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  for (k = 0; k < n; k = k + 1) {
    *seed = *seed * 0x41a7 + (*seed / 0x1f31d) * -0x7fffffff;
    if (*seed < 0) {
      *seed = *seed + 0x7fffffff;
    }
    dVar4 = std::round((double)(ulong)(uint)((1.0 - (float)*seed * 4.656613e-10) *
                                             ((float)local_10 - 0.5) +
                                            (float)*seed * 4.656613e-10 *
                                            ((float)seed_local._4_4_ + 0.5)));
    x._0_4_ = (int)SUB84(dVar4,0);
    if ((int)x < local_10) {
      x._0_4_ = local_10;
    }
    if (seed_local._4_4_ < (int)x) {
      x._0_4_ = seed_local._4_4_;
    }
    piVar3[k] = (int)x;
  }
  return piVar3;
}

Assistant:

int *i4vec_uniform_ab_new ( int n, int a, int b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    I4VEC_UNIFORM_AB_NEW returns a scaled pseudorandom I4VEC.
//
//  Discussion:
//
//    An I4VEC is a vector of I4's.
//
//    The pseudorandom numbers should be uniformly distributed
//    between A and B.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    24 May 2012
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Paul Bratley, Bennett Fox, Linus Schrage,
//    A Guide to Simulation,
//    Second Edition,
//    Springer, 1987,
//    ISBN: 0387964673,
//    LC: QA76.9.C65.B73.
//
//    Bennett Fox,
//    Algorithm 647:
//    Implementation and Relative Efficiency of Quasirandom
//    Sequence Generators,
//    ACM Transactions on Mathematical Software,
//    Volume 12, Number 4, December 1986, pages 362-376.
//
//    Pierre L'Ecuyer,
//    Random Number Generation,
//    in Handbook of Simulation,
//    edited by Jerry Banks,
//    Wiley, 1998,
//    ISBN: 0471134031,
//    LC: T57.62.H37.
//
//    Peter Lewis, Allen Goodman, James Miller,
//    A Pseudo-Random Number Generator for the System/360,
//    IBM Systems Journal,
//    Volume 8, Number 2, 1969, pages 136-143.
//
//  Parameters:
//
//    Input, int N, the dimension of the vector.
//
//    Input, int A, B, the limits of the interval.
//
//    Input/output, int &SEED, the "seed" value, which should NOT be 0.
//    On output, SEED has been updated.
//
//    Output, int IVEC_UNIFORM_AB_NEW[N], a vector of random values 
//    between A and B.
//
{
  int c;
  int i;
  const int i4_huge = 2147483647;
  int k;
  float r;
  int value;
  int *x;
  
  if ( seed == 0 )
  {
    cerr << "\n";
    cerr << "I4VEC_UNIFORM_AB_NEW - Fatal error!\n";
    cerr << "  Input value of SEED = 0.\n";
    exit ( 1 );
  }
//
//  Guarantee A <= B.
//
  if ( b < a )
  {
    c = a;
    a = b;
    b = c;
  }

  x = new int[n];

  for ( i = 0; i < n; i++ )
  {
    k = seed / 127773;

    seed = 16807 * ( seed - k * 127773 ) - k * 2836;

    if ( seed < 0 )
    {
      seed = seed + i4_huge;
    }

    r = static_cast< float > (seed) * 4.656612875E-10;
//
//  Scale R to lie between A-0.5 and B+0.5.
//
    r = ( 1.0 - r ) * ( static_cast< float > ( a) - 0.5 ) 
      +         r   * ( static_cast< float > ( b) + 0.5 );
//
//  Use rounding to convert R to an integer between A and B.
//
    value = round ( r );
//
//  Guarantee A <= VALUE <= B.
//
    if ( value < a )
    {
      value = a;
    }
    if ( b < value )
    {
      value = b;
    }

    x[i] = value;
  }

  return x;
}